

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ExpressionStatement *pEVar3;
  
  pEVar3 = (ExpressionStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionStatement *)this->endPtr < pEVar3 + 1) {
    pEVar3 = (ExpressionStatement *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pEVar3 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pEVar3->super_Statement).kind = ExpressionStatement;
  (pEVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pEVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pEVar3->super_Statement).sourceRange.endLoc = SVar2;
  pEVar3->expr = args;
  return pEVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }